

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

action Search::choose_oracle_action
                 (search_private *priv,size_t ec_cnt,action *oracle_actions,
                 size_t oracle_actions_cnt,action *allowed_actions,size_t allowed_actions_cnt,
                 float *allowed_actions_cost)

{
  wclass *pwVar1;
  size_t sVar2;
  ulong uVar3;
  polylabel *ppVar4;
  uint32_t uVar5;
  ulong uVar6;
  size_t k;
  long lVar7;
  uint64_t *initial;
  size_t sVar8;
  long lVar9;
  bool bVar10;
  bool bVar11;
  float fVar12;
  float fVar13;
  v_array<Search::action_cache> *this_cache;
  v_array<Search::action_cache> *local_58;
  action_cache local_50;
  size_t local_40;
  uint32_t *local_38;
  
  uVar5 = 0xffffffff;
  local_40 = ec_cnt;
  if (priv->use_action_costs == true) {
    sVar8 = allowed_actions_cnt;
    if (allowed_actions == (action *)0x0) {
      sVar8 = priv->A;
    }
    fVar13 = 3.4028235e+38;
    if (sVar8 != 0) {
      sVar2 = 0;
      fVar12 = 3.4028235e+38;
      do {
        fVar13 = allowed_actions_cost[sVar2];
        if (fVar12 <= allowed_actions_cost[sVar2]) {
          fVar13 = fVar12;
        }
        sVar2 = sVar2 + 1;
        fVar12 = fVar13;
      } while (sVar8 != sVar2);
    }
    if (sVar8 != 0 && fVar13 < 3.4028235e+38) {
      uVar5 = 0xffffffff;
      sVar2 = 0;
      uVar3 = 0;
      local_38 = oracle_actions;
      do {
        if ((allowed_actions_cost[sVar2] <= fVar13) &&
           ((uVar6 = uVar3 + 1, uVar3 == 0 ||
            (fVar12 = merand48(&priv->all->random_state), uVar3 = uVar6, oracle_actions = local_38,
            (double)fVar12 < 1.0 / (double)uVar6)))) {
          if (allowed_actions == (action *)0x0) {
            uVar5 = (int)sVar2 + 1;
            uVar3 = uVar6;
          }
          else {
            uVar5 = allowed_actions[sVar2];
            uVar3 = uVar6;
          }
        }
        sVar2 = sVar2 + 1;
      } while (sVar8 != sVar2);
    }
  }
  if (uVar5 == 0xffffffff) {
    if (((0.0 < priv->perturb_oracle) && (priv->state == INIT_TRAIN)) &&
       (fVar13 = merand48(&priv->all->random_state), fVar13 < priv->perturb_oracle)) {
      oracle_actions_cnt = 0;
    }
    if (oracle_actions_cnt == 0) {
      if (allowed_actions_cnt == 0) {
        initial = &priv->all->random_state;
        if (priv->is_ldf == true) {
          fVar13 = merand48(initial);
          lVar7 = (long)(fVar13 * (float)local_40);
          uVar5 = (uint)lVar7 |
                  (uint)(long)(fVar13 * (float)local_40 - 9.223372e+18) & (uint)(lVar7 >> 0x3f);
        }
        else {
          uVar3 = priv->A;
          fVar13 = merand48(initial);
          fVar13 = fVar13 * (float)uVar3;
          lVar7 = (long)fVar13;
          uVar5 = ((uint)lVar7 | (uint)(long)(fVar13 - 9.223372e+18) & (uint)(lVar7 >> 0x3f)) + 1;
        }
      }
      else {
        fVar13 = merand48(&priv->all->random_state);
        uVar3 = (ulong)(fVar13 * (float)allowed_actions_cnt);
        uVar5 = allowed_actions
                [(long)(fVar13 * (float)allowed_actions_cnt - 9.223372e+18) & (long)uVar3 >> 0x3f |
                 uVar3];
      }
    }
    else {
      fVar13 = merand48(&priv->all->random_state);
      uVar3 = (ulong)(fVar13 * (float)oracle_actions_cnt);
      uVar5 = oracle_actions
              [(long)(fVar13 * (float)oracle_actions_cnt - 9.223372e+18) & (long)uVar3 >> 0x3f |
               uVar3];
    }
  }
  bVar11 = false;
  if ((priv->state == INIT_TRAIN) && (bVar11 = false, priv->metatask != (search_metatask *)0x0)) {
    bVar11 = priv->metaoverride != (BaseTask *)0x0;
  }
  if ((priv->state == INIT_TRAIN) && (bVar11)) {
    local_58 = (v_array<Search::action_cache> *)operator_new(0x20);
    local_58->_begin = (action_cache *)0x0;
    local_58->_end = (action_cache *)0x0;
    local_58->end_array = (action_cache *)0x0;
    local_58->erase_count = 0;
    ppVar4 = allowed_actions_to_ld(priv,1,allowed_actions,allowed_actions_cnt,allowed_actions_cost);
    pwVar1 = (ppVar4->cs).costs._begin;
    lVar7 = (long)(ppVar4->cs).costs._end - (long)pwVar1;
    if (lVar7 != 0) {
      lVar7 = lVar7 >> 4;
      bVar11 = oracle_actions_cnt != 0;
      lVar9 = 0;
      do {
        local_50.k = pwVar1[lVar9].class_index;
        bVar10 = oracle_actions != (uint32_t *)0x0 && bVar11;
        if ((oracle_actions != (uint32_t *)0x0 && bVar11) &&
           (bVar10 = bVar11, *oracle_actions != local_50.k)) {
          uVar3 = 1;
          do {
            uVar6 = uVar3;
            if (oracle_actions_cnt == uVar6) break;
            uVar3 = uVar6 + 1;
          } while (oracle_actions[uVar6] != local_50.k);
          bVar10 = uVar6 < oracle_actions_cnt;
        }
        local_50.cost = 0.0;
        if (!bVar10) {
          local_50.cost = 1.0;
        }
        local_50.is_opt = local_50.k == uVar5;
        local_50.min_cost = 0.0;
        v_array<Search::action_cache>::push_back(local_58,&local_50);
        lVar9 = lVar9 + 1;
      } while (lVar9 != lVar7 + (ulong)(lVar7 == 0));
    }
    v_array<v_array<Search::action_cache>_*>::push_back(&priv->memo_foreach_action,&local_58);
  }
  return uVar5;
}

Assistant:

action choose_oracle_action(search_private& priv, size_t ec_cnt, const action* oracle_actions,
    size_t oracle_actions_cnt, const action* allowed_actions, size_t allowed_actions_cnt,
    const float* allowed_actions_cost)
{
  action a = (action)-1;
  if (priv.use_action_costs)
  {
    size_t K = (allowed_actions == nullptr) ? priv.A : allowed_actions_cnt;
    cdbg << "costs = [";
    for (size_t k = 0; k < K; k++) cdbg << ' ' << allowed_actions_cost[k];
    cdbg << " ]" << endl;
    float min_cost = FLT_MAX;
    for (size_t k = 0; k < K; k++) min_cost = min(min_cost, allowed_actions_cost[k]);
    cdbg << "min_cost = " << min_cost;
    if (min_cost < FLT_MAX)
    {
      size_t count = 0;
      for (size_t k = 0; k < K; k++)
        if (allowed_actions_cost[k] <= min_cost)
        {
          cdbg << ", hit @ " << k;
          count++;
          if ((count == 1) || (merand48(priv.all->random_state) < 1. / (float)count))
          {
            a = (allowed_actions == nullptr) ? (uint32_t)(k + 1) : allowed_actions[k];
            cdbg << "***";
          }
        }
    }
    cdbg << endl;
  }

  if (a == (action)-1)
  {
    if ((priv.perturb_oracle > 0.) && (priv.state == INIT_TRAIN) &&
        (merand48(priv.all->random_state) < priv.perturb_oracle))
      oracle_actions_cnt = 0;
    a = (oracle_actions_cnt > 0)
        ? oracle_actions[random(priv.all->random_state, oracle_actions_cnt)]
        : (allowed_actions_cnt > 0) ? allowed_actions[random(priv.all->random_state, allowed_actions_cnt)]
                                    : priv.is_ldf ? (action)random(priv.all->random_state, ec_cnt)
                                                  : (action)(1 + random(priv.all->random_state, priv.A));
  }
  cdbg << "choose_oracle_action from oracle_actions = [";
  for (size_t i = 0; i < oracle_actions_cnt; i++) cdbg << " " << oracle_actions[i];
  cdbg << " ], ret=" << a << endl;
  if (need_memo_foreach_action(priv) && (priv.state == INIT_TRAIN))
  {
    v_array<action_cache>* this_cache = new v_array<action_cache>();
    *this_cache = v_init<action_cache>();
    // TODO we don't really need to construct this polylabel
    polylabel l = allowed_actions_to_ld(priv, 1, allowed_actions, allowed_actions_cnt, allowed_actions_cost);
    size_t K = cs_get_costs_size(priv.cb_learner, l);
    for (size_t k = 0; k < K; k++)
    {
      action cl = cs_get_cost_index(priv.cb_learner, l, k);
      float cost = array_contains(cl, oracle_actions, oracle_actions_cnt) ? 0.f : 1.f;
      this_cache->push_back(action_cache(0., cl, cl == a, cost));
    }
    assert(priv.memo_foreach_action.size() == priv.meta_t + priv.t - 1);
    priv.memo_foreach_action.push_back(this_cache);
    cdbg << "memo_foreach_action[" << priv.meta_t + priv.t - 1 << "] = " << this_cache << " from oracle" << endl;
  }
  return a;
}